

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O2

int write_iff(lyout *out,lys_module *module,lys_iffeature *expr,int module_name_or_prefix,
             int *index_e,int *index_f)

{
  bool bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  lys_module *plVar7;
  lys_module *plVar8;
  char *pcVar9;
  int iVar10;
  int local_34;
  
  local_34 = 0;
  do {
    iVar6 = *index_e;
    uVar2 = iff_getop(expr->expr,iVar6);
    iVar4 = *index_e;
    *index_e = iVar4 + 1;
    switch(uVar2) {
    case '\0':
      iVar6 = ly_print(out,"not ");
      local_34 = local_34 + iVar6;
      break;
    case '\x01':
      iVar10 = 0;
      bVar1 = true;
      if (iVar4 < 1 || iVar6 == 0) {
        pcVar9 = "and";
      }
      else {
        uVar3 = iff_getop(expr->expr,iVar4 + -1);
        pcVar9 = "and";
        if (uVar3 == '\0') {
LAB_0015f00d:
          bVar1 = false;
          iVar10 = ly_print(out,"(");
          pcVar9 = "and";
          if (uVar2 == '\x02') {
            pcVar9 = "or";
          }
        }
      }
LAB_0015f03e:
      iVar4 = write_iff(out,module,expr,module_name_or_prefix,index_e,index_f);
      iVar5 = ly_print(out," %s ",pcVar9);
      iVar6 = write_iff(out,module,expr,module_name_or_prefix,index_e,index_f);
      iVar6 = iVar6 + iVar5 + iVar4 + iVar10;
      if (!bVar1) {
        iVar4 = ly_print(out,")");
        iVar6 = iVar6 + iVar4;
      }
LAB_0015f0fa:
      return iVar6 + local_34;
    case '\x02':
      if (iVar6 != 0) goto LAB_0015f00d;
      iVar10 = 0;
      bVar1 = true;
      pcVar9 = "or";
      goto LAB_0015f03e;
    case '\x03':
      plVar7 = lys_main_module(expr->features[*index_f]->module);
      plVar8 = lys_main_module(module);
      if (plVar7 == plVar8) {
        iVar4 = 0;
      }
      else {
        plVar7 = lys_main_module(expr->features[*index_f]->module);
        pcVar9 = plVar7->name;
        if (module_name_or_prefix == 0) {
          pcVar9 = transform_module_name2import_prefix(module,pcVar9);
        }
        iVar4 = ly_print(out,"%s:",pcVar9);
      }
      iVar6 = ly_print(out,expr->features[*index_f]->name);
      iVar6 = iVar6 + iVar4;
      *index_f = *index_f + 1;
      goto LAB_0015f0fa;
    default:
      iVar6 = 0;
      goto LAB_0015f0fa;
    }
  } while( true );
}

Assistant:

static int
write_iff(struct lyout *out, const struct lys_module *module, struct lys_iffeature *expr, int module_name_or_prefix,
          int *index_e, int *index_f)
{
    int count = 0, brackets_flag = *index_e;
    uint8_t op;

    op = iff_getop(expr->expr, *index_e);
    (*index_e)++;

    switch (op) {
    case LYS_IFF_F:
        if (lys_main_module(expr->features[*index_f]->module) != lys_main_module(module)) {
            if (module_name_or_prefix) {
                count += ly_print(out, "%s:", lys_main_module(expr->features[*index_f]->module)->name);
            } else {
                count += ly_print(out, "%s:", transform_module_name2import_prefix(module, lys_main_module(expr->features[*index_f]->module)->name));
            }
        }
        count += ly_print(out, expr->features[*index_f]->name);
        (*index_f)++;
        break;
    case LYS_IFF_NOT:
        count += ly_print(out, "not ");
        count += write_iff(out, module, expr, module_name_or_prefix, index_e, index_f);
        break;
    case LYS_IFF_AND:
        if (brackets_flag) {
            /* AND need brackets only if previous op was not */
            if (*index_e < 2 || iff_getop(expr->expr, *index_e - 2) != LYS_IFF_NOT) {
                brackets_flag = 0;
            }
        }
        /* no break */
    case LYS_IFF_OR:
        if (brackets_flag) {
            count += ly_print(out, "(");
        }
        count += write_iff(out, module, expr, module_name_or_prefix, index_e, index_f);
        count += ly_print(out, " %s ", op == LYS_IFF_OR ? "or" : "and");
        count += write_iff(out, module, expr, module_name_or_prefix, index_e, index_f);
        if (brackets_flag) {
            count += ly_print(out, ")");
        }
    }

    return count;
}